

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

Bool CheckWrapIndent(TidyDocImpl *doc,uint indent)

{
  uint uVar1;
  TidyPrintImpl *pprint;
  uint indent_local;
  TidyDocImpl *doc_local;
  
  uVar1 = GetSpaces(&doc->pprint);
  if ((ulong)(uVar1 + (doc->pprint).linelen) < (doc->config).value[0x5d].v) {
    doc_local._4_4_ = no;
  }
  else {
    WrapLine(doc);
    if ((doc->pprint).indent[0].spaces < 0) {
      (doc->pprint).indent[0].spaces = indent;
    }
    doc_local._4_4_ = yes;
  }
  return doc_local._4_4_;
}

Assistant:

static Bool CheckWrapIndent( TidyDocImpl* doc, uint indent )
{
    TidyPrintImpl* pprint = &doc->pprint;
    if ( GetSpaces(pprint) + pprint->linelen >= cfg(doc, TidyWrapLen) )
    {
        WrapLine( doc );
        if ( pprint->indent[ 0 ].spaces < 0 )
        {
#if defined(ENABLE_DEBUG_LOG) && defined(DEBUG_INDENT)
            SPRTF("%s Indent from %d to %d\n", __FUNCTION__, pprint->indent[ 0 ].spaces, indent );
#endif  
            pprint->indent[ 0 ].spaces = indent;
        }
        return yes;
    }
    return no;
}